

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# point_cloud_encoder.cc
# Opt level: O1

bool __thiscall draco::PointCloudEncoder::GenerateAttributesEncoders(PointCloudEncoder *this)

{
  pointer puVar1;
  pointer piVar2;
  __uniq_ptr_impl<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_> _Var3;
  long lVar4;
  int iVar5;
  long lVar6;
  bool bVar7;
  uint uVar8;
  ulong uVar9;
  int iVar10;
  
  iVar5 = (int)((ulong)((long)(this->point_cloud_->attributes_).
                              super__Vector_base<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>,_std::allocator<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(this->point_cloud_->attributes_).
                             super__Vector_base<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>,_std::allocator<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 3);
  bVar7 = iVar5 < 1;
  if (0 < iVar5) {
    iVar5 = (*this->_vptr_PointCloudEncoder[9])(this,0);
    if ((char)iVar5 != '\0') {
      uVar8 = 1;
      do {
        iVar5 = (int)((ulong)((long)(this->point_cloud_->attributes_).
                                    super__Vector_base<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>,_std::allocator<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(this->point_cloud_->attributes_).
                                   super__Vector_base<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>,_std::allocator<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start) >> 3);
        bVar7 = iVar5 <= (int)uVar8;
        if (iVar5 <= (int)uVar8) goto LAB_00147705;
        iVar5 = (*this->_vptr_PointCloudEncoder[9])(this,(ulong)uVar8);
        uVar8 = uVar8 + 1;
      } while ((char)iVar5 != '\0');
    }
    if (bVar7 == false) {
      return false;
    }
  }
LAB_00147705:
  std::vector<int,_std::allocator<int>_>::resize
            (&this->attribute_to_encoder_map_,
             (long)(int)((ulong)((long)(this->point_cloud_->attributes_).
                                       super__Vector_base<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>,_std::allocator<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                (long)(this->point_cloud_->attributes_).
                                      super__Vector_base<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>,_std::allocator<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start) >> 3));
  puVar1 = (this->attributes_encoders_).
           super__Vector_base<std::unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>,_std::allocator<std::unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar6 = (long)(this->attributes_encoders_).
                super__Vector_base<std::unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>,_std::allocator<std::unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)puVar1;
  if (lVar6 != 0) {
    piVar2 = (this->attribute_to_encoder_map_).super__Vector_base<int,_std::allocator<int>_>._M_impl
             .super__Vector_impl_data._M_start;
    uVar9 = 0;
    do {
      _Var3._M_t.
      super__Tuple_impl<0UL,_draco::AttributesEncoder_*,_std::default_delete<draco::AttributesEncoder>_>
      .super__Head_base<0UL,_draco::AttributesEncoder_*,_false>._M_head_impl =
           puVar1[uVar9]._M_t.
           super___uniq_ptr_impl<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>
           ._M_t;
      lVar4 = *(long *)((long)_Var3._M_t.
                              super__Tuple_impl<0UL,_draco::AttributesEncoder_*,_std::default_delete<draco::AttributesEncoder>_>
                              .super__Head_base<0UL,_draco::AttributesEncoder_*,_false>._M_head_impl
                       + 8);
      iVar5 = (int)((ulong)(*(long *)((long)_Var3._M_t.
                                            super__Tuple_impl<0UL,_draco::AttributesEncoder_*,_std::default_delete<draco::AttributesEncoder>_>
                                            .
                                            super__Head_base<0UL,_draco::AttributesEncoder_*,_false>
                                            ._M_head_impl + 0x10) - lVar4) >> 2);
      if (iVar5 != 0) {
        iVar10 = 0;
        do {
          piVar2[*(int *)(lVar4 + (long)iVar10 * 4)] = (int)uVar9;
          iVar10 = iVar10 + 1;
        } while (iVar5 != iVar10);
      }
      uVar9 = uVar9 + 1;
    } while ((uVar9 & 0xffffffff) < (ulong)(lVar6 >> 3));
  }
  return bVar7;
}

Assistant:

bool PointCloudEncoder::GenerateAttributesEncoders() {
  for (int i = 0; i < point_cloud_->num_attributes(); ++i) {
    if (!GenerateAttributesEncoder(i)) {
      return false;
    }
  }
  attribute_to_encoder_map_.resize(point_cloud_->num_attributes());
  for (uint32_t i = 0; i < attributes_encoders_.size(); ++i) {
    for (uint32_t j = 0; j < attributes_encoders_[i]->num_attributes(); ++j) {
      attribute_to_encoder_map_[attributes_encoders_[i]->GetAttributeId(j)] = i;
    }
  }
  return true;
}